

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_> *
__thiscall
sf::String::toUtf32_abi_cxx11_
          (basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>
           *__return_storage_ptr__,String *this)

{
  pointer puVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  puVar1 = (this->m_string)._M_dataplus._M_p;
  std::__cxx11::
  basic_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>::
  _M_construct<unsigned_int*>
            ((basic_string<unsigned_int,std::char_traits<unsigned_int>,std::allocator<unsigned_int>>
              *)__return_storage_ptr__,puVar1,puVar1 + (this->m_string)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Uint32> String::toUtf32() const
{
    return m_string;
}